

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourcePack.cpp
# Opt level: O0

void __thiscall ResourcePack::load_shader(ResourcePack *this,string *name)

{
  PFNGLGETPROGRAMINFOLOGPROC p_Var1;
  PFNGLGETSHADERINFOLOGPROC p_Var2;
  undefined4 uVar3;
  GLsizei GVar4;
  byte bVar5;
  int iVar6;
  ostream *poVar7;
  char *pcVar8;
  streambuf *psVar9;
  undefined8 uVar10;
  reference pvVar11;
  mapped_type *pmVar12;
  allocator_type local_b71;
  undefined1 local_b70 [8];
  vector<char,_std::allocator<char>_> ProgramErrorMessage;
  GLuint ProgramID;
  vector<char,_std::allocator<char>_> FragmentShaderErrorMessage;
  char *FragmentSourcePointer;
  undefined1 local_b28 [8];
  vector<char,_std::allocator<char>_> VertexShaderErrorMessage;
  char *VertexSourcePointer;
  int InfoLogLength;
  GLint Result;
  stringstream local_ae0 [8];
  stringstream sstr_1;
  ostream local_ad0 [376];
  undefined1 local_958 [8];
  ifstream FragmentShaderStream;
  string local_750 [8];
  string FragmentShaderCode;
  stringstream local_710 [8];
  stringstream sstr;
  ostream local_700 [376];
  undefined1 local_588 [8];
  ifstream VertexShaderStream;
  string local_380 [8];
  string VertexShaderCode;
  GLuint FragmentShaderID;
  GLuint VertexShaderID;
  string fragment_file_path;
  string vertex_file_path;
  ostringstream local_308 [8];
  ostringstream fragment_file_path_stream;
  ostringstream local_190 [8];
  ostringstream vertex_file_path_stream;
  string *name_local;
  ResourcePack *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__cxx11::ostringstream::ostringstream(local_308);
  poVar7 = std::operator<<((ostream *)local_190,"../res/");
  poVar7 = std::operator<<(poVar7,(string *)name);
  std::operator<<(poVar7,".vert");
  poVar7 = std::operator<<((ostream *)local_308,"../res/");
  poVar7 = std::operator<<(poVar7,(string *)name);
  std::operator<<(poVar7,".frag");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::str();
  VertexShaderCode.field_2._12_4_ = (*__glewCreateShader)(0x8b31);
  VertexShaderCode.field_2._8_4_ = (*__glewCreateShader)(0x8b30);
  std::__cxx11::string::string(local_380);
  pcVar8 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_588,pcVar8,_S_in);
  bVar5 = std::ifstream::is_open();
  if ((bVar5 & 1) != 0) {
    std::__cxx11::stringstream::stringstream(local_710);
    psVar9 = (streambuf *)std::ifstream::rdbuf();
    std::ostream::operator<<(local_700,psVar9);
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=
              (local_380,(string *)(FragmentShaderCode.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(FragmentShaderCode.field_2._M_local_buf + 8));
    std::ifstream::close();
    std::__cxx11::stringstream::~stringstream(local_710);
    std::__cxx11::string::string(local_750);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(local_958,pcVar8,_S_in);
    bVar5 = std::ifstream::is_open();
    if ((bVar5 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_ae0);
      psVar9 = (streambuf *)std::ifstream::rdbuf();
      std::ostream::operator<<(local_ad0,psVar9);
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator=(local_750,(string *)&InfoLogLength);
      std::__cxx11::string::~string((string *)&InfoLogLength);
      std::ifstream::close();
      std::__cxx11::stringstream::~stringstream(local_ae0);
    }
    VertexSourcePointer._4_4_ = 0;
    uVar10 = std::__cxx11::string::c_str();
    printf("Compiling shader : %s\n",uVar10);
    VertexShaderErrorMessage.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
         std::__cxx11::string::c_str();
    (*__glewShaderSource)
              (VertexShaderCode.field_2._12_4_,1,
               (GLchar **)
               &VertexShaderErrorMessage.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                field_0x10,(GLint *)0x0);
    (*__glewCompileShader)(VertexShaderCode.field_2._12_4_);
    (*__glewGetShaderiv)
              (VertexShaderCode.field_2._12_4_,0x8b81,(GLint *)((long)&VertexSourcePointer + 4));
    (*__glewGetShaderiv)(VertexShaderCode.field_2._12_4_,0x8b84,(GLint *)&VertexSourcePointer);
    if (0 < (int)VertexSourcePointer) {
      iVar6 = (int)VertexSourcePointer + 1;
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_b28,(long)iVar6,
                 (allocator_type *)((long)&FragmentSourcePointer + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&FragmentSourcePointer + 7));
      uVar3 = VertexShaderCode.field_2._12_4_;
      GVar4 = (int)VertexSourcePointer;
      p_Var2 = __glewGetShaderInfoLog;
      pvVar11 = std::vector<char,_std::allocator<char>_>::operator[]
                          ((vector<char,_std::allocator<char>_> *)local_b28,0);
      (*p_Var2)(uVar3,GVar4,(GLsizei *)0x0,pvVar11);
      pvVar11 = std::vector<char,_std::allocator<char>_>::operator[]
                          ((vector<char,_std::allocator<char>_> *)local_b28,0);
      printf("%s\n",pvVar11);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_b28);
    }
    uVar10 = std::__cxx11::string::c_str();
    printf("Compiling shader : %s\n",uVar10);
    FragmentShaderErrorMessage.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
         std::__cxx11::string::c_str();
    (*__glewShaderSource)
              (VertexShaderCode.field_2._8_4_,1,
               (GLchar **)
               &FragmentShaderErrorMessage.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                field_0x10,(GLint *)0x0);
    (*__glewCompileShader)(VertexShaderCode.field_2._8_4_);
    (*__glewGetShaderiv)
              (VertexShaderCode.field_2._8_4_,0x8b81,(GLint *)((long)&VertexSourcePointer + 4));
    (*__glewGetShaderiv)(VertexShaderCode.field_2._8_4_,0x8b84,(GLint *)&VertexSourcePointer);
    if (0 < (int)VertexSourcePointer) {
      iVar6 = (int)VertexSourcePointer + 1;
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&ProgramID,(long)iVar6,
                 (allocator_type *)
                 &ProgramErrorMessage.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  field_0x17);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 &ProgramErrorMessage.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  field_0x17);
      uVar3 = VertexShaderCode.field_2._8_4_;
      GVar4 = (int)VertexSourcePointer;
      p_Var2 = __glewGetShaderInfoLog;
      pvVar11 = std::vector<char,_std::allocator<char>_>::operator[]
                          ((vector<char,_std::allocator<char>_> *)&ProgramID,0);
      (*p_Var2)(uVar3,GVar4,(GLsizei *)0x0,pvVar11);
      pvVar11 = std::vector<char,_std::allocator<char>_>::operator[]
                          ((vector<char,_std::allocator<char>_> *)&ProgramID,0);
      printf("%s\n",pvVar11);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)&ProgramID);
    }
    printf("Linking program\n");
    ProgramErrorMessage.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ =
         (*__glewCreateProgram)();
    (*__glewAttachShader)
              (ProgramErrorMessage.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_,
               VertexShaderCode.field_2._12_4_);
    (*__glewAttachShader)
              (ProgramErrorMessage.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_,
               VertexShaderCode.field_2._8_4_);
    (*__glewLinkProgram)
              (ProgramErrorMessage.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_);
    (*__glewGetProgramiv)
              (ProgramErrorMessage.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_,
               0x8b82,(GLint *)((long)&VertexSourcePointer + 4));
    (*__glewGetProgramiv)
              (ProgramErrorMessage.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_,
               0x8b84,(GLint *)&VertexSourcePointer);
    if (0 < (int)VertexSourcePointer) {
      iVar6 = (int)VertexSourcePointer + 1;
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_b70,(long)iVar6,&local_b71);
      std::allocator<char>::~allocator(&local_b71);
      uVar3 = ProgramErrorMessage.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_;
      p_Var1 = __glewGetProgramInfoLog;
      pvVar11 = std::vector<char,_std::allocator<char>_>::operator[]
                          ((vector<char,_std::allocator<char>_> *)local_b70,0);
      (*p_Var1)(uVar3,(int)VertexSourcePointer,(GLsizei *)0x0,pvVar11);
      pvVar11 = std::vector<char,_std::allocator<char>_>::operator[]
                          ((vector<char,_std::allocator<char>_> *)local_b70,0);
      printf("%s\n",pvVar11);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_b70);
    }
    (*__glewDetachShader)
              (ProgramErrorMessage.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_,
               VertexShaderCode.field_2._12_4_);
    (*__glewDetachShader)
              (ProgramErrorMessage.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_,
               VertexShaderCode.field_2._8_4_);
    (*__glewDeleteShader)(VertexShaderCode.field_2._12_4_);
    (*__glewDeleteShader)(VertexShaderCode.field_2._8_4_);
    uVar3 = ProgramErrorMessage.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_;
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              ::operator[](&this->programs,name);
    *pmVar12 = uVar3;
    std::ifstream::~ifstream(local_958);
    std::__cxx11::string::~string(local_750);
    std::ifstream::~ifstream(local_588);
    std::__cxx11::string::~string(local_380);
    std::__cxx11::string::~string((string *)&FragmentShaderID);
    std::__cxx11::string::~string((string *)(fragment_file_path.field_2._M_local_buf + 8));
    std::__cxx11::ostringstream::~ostringstream(local_308);
    std::__cxx11::ostringstream::~ostringstream(local_190);
    return;
  }
  uVar10 = std::__cxx11::string::c_str();
  printf("Could not open shader %s\n",uVar10);
  getchar();
  exit(1);
}

Assistant:

void ResourcePack::load_shader(std::string& name) {
    std::ostringstream vertex_file_path_stream, fragment_file_path_stream;
    vertex_file_path_stream << "../res/" << name << ".vert";
    fragment_file_path_stream << "../res/" << name << ".frag";
   
    std::string vertex_file_path = vertex_file_path_stream.str();
    std::string fragment_file_path = fragment_file_path_stream.str();

    // Create the shaders
    GLuint VertexShaderID = glCreateShader(GL_VERTEX_SHADER);
    GLuint FragmentShaderID = glCreateShader(GL_FRAGMENT_SHADER);

    // Read the Vertex Shader code from the file
    std::string VertexShaderCode;
    std::ifstream VertexShaderStream(vertex_file_path.c_str(), std::ios::in);
    if(VertexShaderStream.is_open()) {
        std::stringstream sstr;
        sstr << VertexShaderStream.rdbuf();
        VertexShaderCode = sstr.str();
        VertexShaderStream.close();
    }
    else {
        printf("Could not open shader %s\n", vertex_file_path.c_str());
        getchar();
        exit(1);
    }

    // Read the Fragment Shader code from the file
    std::string FragmentShaderCode;
    std::ifstream FragmentShaderStream(fragment_file_path.c_str(), std::ios::in);
    if(FragmentShaderStream.is_open()){
        std::stringstream sstr;
        sstr << FragmentShaderStream.rdbuf();
        FragmentShaderCode = sstr.str();
        FragmentShaderStream.close();
    }

    GLint Result = GL_FALSE;
    int InfoLogLength;

    // Compile Vertex Shader
    printf("Compiling shader : %s\n", vertex_file_path.c_str());
    char const * VertexSourcePointer = VertexShaderCode.c_str();
    glShaderSource(VertexShaderID, 1, &VertexSourcePointer , NULL);
    glCompileShader(VertexShaderID);

    // Check Vertex Shader
    glGetShaderiv(VertexShaderID, GL_COMPILE_STATUS, &Result);
    glGetShaderiv(VertexShaderID, GL_INFO_LOG_LENGTH, &InfoLogLength);
    if ( InfoLogLength > 0 ){
        std::vector<char> VertexShaderErrorMessage(InfoLogLength+1);
        glGetShaderInfoLog(VertexShaderID, InfoLogLength, NULL, &VertexShaderErrorMessage[0]);
        printf("%s\n", &VertexShaderErrorMessage[0]);
    }

    // Compile Fragment Shader
    printf("Compiling shader : %s\n", fragment_file_path.c_str());
    char const * FragmentSourcePointer = FragmentShaderCode.c_str();
    glShaderSource(FragmentShaderID, 1, &FragmentSourcePointer , NULL);
    glCompileShader(FragmentShaderID);

    // Check Fragment Shader
    glGetShaderiv(FragmentShaderID, GL_COMPILE_STATUS, &Result);
    glGetShaderiv(FragmentShaderID, GL_INFO_LOG_LENGTH, &InfoLogLength);
    if ( InfoLogLength > 0 ){
        std::vector<char> FragmentShaderErrorMessage(InfoLogLength+1);
        glGetShaderInfoLog(FragmentShaderID, InfoLogLength, NULL, &FragmentShaderErrorMessage[0]);
        printf("%s\n", &FragmentShaderErrorMessage[0]);
    }

    // Link the program
    printf("Linking program\n");
    GLuint ProgramID = glCreateProgram();
    glAttachShader(ProgramID, VertexShaderID);
    glAttachShader(ProgramID, FragmentShaderID);
    glLinkProgram(ProgramID);

    // Check the program
    glGetProgramiv(ProgramID, GL_LINK_STATUS, &Result);
    glGetProgramiv(ProgramID, GL_INFO_LOG_LENGTH, &InfoLogLength);
    if (InfoLogLength > 0){
        std::vector<char> ProgramErrorMessage(InfoLogLength+1);
        glGetProgramInfoLog(ProgramID, InfoLogLength, NULL, &ProgramErrorMessage[0]);
        printf("%s\n", &ProgramErrorMessage[0]);
    }

    glDetachShader(ProgramID, VertexShaderID);
    glDetachShader(ProgramID, FragmentShaderID);

    glDeleteShader(VertexShaderID);
    glDeleteShader(FragmentShaderID);

    programs[name] = ProgramID;
}